

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

unsigned_long
testing::internal::anon_unknown_32::ReadProcFileField<unsigned_long>(string *filename,int field)

{
  ulong uVar1;
  undefined8 uVar2;
  ulong local_258;
  unsigned_long output;
  istream local_240 [8];
  ifstream file;
  string local_38 [8];
  string dummy;
  int field_local;
  string *filename_local;
  
  dummy.field_2._12_4_ = field;
  std::__cxx11::string::string(local_38);
  uVar2 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_240,uVar2,8);
  while (0 < (int)dummy.field_2._12_4_) {
    dummy.field_2._12_4_ = dummy.field_2._12_4_ + -1;
    std::operator>>(local_240,local_38);
  }
  local_258 = 0;
  dummy.field_2._12_4_ = dummy.field_2._12_4_ + -1;
  std::istream::operator>>(local_240,&local_258);
  uVar1 = local_258;
  std::ifstream::~ifstream(local_240);
  std::__cxx11::string::~string(local_38);
  return uVar1;
}

Assistant:

T ReadProcFileField(const std::string& filename, int field) {
  std::string dummy;
  std::ifstream file(filename.c_str());
  while (field-- > 0) {
    file >> dummy;
  }
  T output = 0;
  file >> output;
  return output;
}